

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O2

bool __thiscall
cmUVProcessChain::InternalData::Prepare(InternalData *this,cmUVProcessChainBuilder *builder)

{
  StdioType SVar1;
  ProcessData *pPVar2;
  __uniq_ptr_data<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>,_true,_true>
  _Var3;
  int iVar4;
  uv_loop_t *puVar5;
  uv_pipe_s *puVar6;
  bool bVar7;
  uv_pipe_ptr *this_00;
  ulong uVar8;
  bool bVar9;
  long lStack_50;
  int pipeFd [2];
  
  this->Builder = builder;
  puVar5 = builder->Loop;
  if (puVar5 == (uv_loop_t *)0x0) {
    cm::uv_loop_ptr::init(&this->BuiltinLoop,(EVP_PKEY_CTX *)0x0);
    puVar5 = cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->BuiltinLoop);
    builder = this->Builder;
  }
  this->Loop = puVar5;
  SVar1 = (builder->Stdio)._M_elems[0].Type;
  if (SVar1 == None) {
    lStack_50 = 0x30;
    iVar4 = 0;
LAB_0011e919:
    *(int *)((long)&this->Builder + lStack_50) = iVar4;
  }
  else if (SVar1 == External) {
    (this->InputStreamData).Stdio.flags = UV_INHERIT_FD;
    iVar4 = (builder->Stdio)._M_elems[0].FileDescriptor;
    lStack_50 = 0x38;
    goto LAB_0011e919;
  }
  SVar1 = (builder->Stdio)._M_elems[2].Type;
  if (SVar1 == External) {
    (this->ErrorStreamData).Stdio.flags = UV_INHERIT_FD;
    (this->ErrorStreamData).Stdio.data.fd = (builder->Stdio)._M_elems[2].FileDescriptor;
  }
  else if (SVar1 == Builtin) {
    iVar4 = cmGetPipes(pipeFd);
    if (iVar4 < 0) {
      return false;
    }
    (this->ErrorStreamData).BuiltinStream = pipeFd[0];
    (this->ErrorStreamData).Stdio.flags = UV_INHERIT_FD;
    (this->ErrorStreamData).Stdio.data.fd = pipeFd[1];
    iVar4 = cm::uv_pipe_ptr::init(&this->TempErrorPipe,(EVP_PKEY_CTX *)this->Loop);
    if (iVar4 < 0) {
      return false;
    }
    puVar6 = cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       (&(this->TempErrorPipe).super_uv_handle_ptr_<uv_pipe_s>);
    iVar4 = uv_pipe_open(puVar6,(this->ErrorStreamData).Stdio.data.fd);
    if (iVar4 < 0) {
      return false;
    }
    builder = this->Builder;
  }
  else if (SVar1 == None) {
    (this->ErrorStreamData).Stdio.flags = UV_IGNORE;
  }
  SVar1 = (builder->Stdio)._M_elems[1].Type;
  if (SVar1 == None) {
    lStack_50 = 0x48;
    iVar4 = 0;
  }
  else {
    if (SVar1 == External) {
      (this->OutputStreamData).Stdio.flags = UV_INHERIT_FD;
      iVar4 = (builder->Stdio)._M_elems[1].FileDescriptor;
    }
    else {
      if (SVar1 != Builtin) goto LAB_0011e9e8;
      if (builder->MergedBuiltinStreams != true) {
        iVar4 = cmGetPipes(pipeFd);
        if (-1 < iVar4) {
          (this->OutputStreamData).BuiltinStream = pipeFd[0];
          (this->OutputStreamData).Stdio.flags = UV_INHERIT_FD;
          (this->OutputStreamData).Stdio.data.fd = pipeFd[1];
          iVar4 = cm::uv_pipe_ptr::init(&this->TempOutputPipe,(EVP_PKEY_CTX *)this->Loop);
          if (-1 < iVar4) {
            puVar6 = cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                               (&(this->TempOutputPipe).super_uv_handle_ptr_<uv_pipe_s>);
            iVar4 = uv_pipe_open(puVar6,(this->OutputStreamData).Stdio.data.fd);
            if (-1 < iVar4) goto LAB_0011e9e8;
          }
        }
        return false;
      }
      iVar4 = (this->ErrorStreamData).Stdio.data.fd;
      (this->OutputStreamData).BuiltinStream = (this->ErrorStreamData).BuiltinStream;
      (this->OutputStreamData).Stdio.flags = UV_INHERIT_FD;
    }
    lStack_50 = 0x50;
  }
  *(int *)((long)&this->Builder + lStack_50) = iVar4;
LAB_0011e9e8:
  bVar7 = true;
  uVar8 = 0;
  do {
    bVar9 = (ulong)(((long)(this->Builder->Processes).
                           super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->Builder->Processes).
                          super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar8;
    if (bVar9) {
      return bVar9;
    }
    std::make_unique<cmUVProcessChain::InternalData::ProcessData>();
    std::
    vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
    ::
    emplace_back<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>
              ((vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>,std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,std::default_delete<cmUVProcessChain::InternalData::ProcessData>>>>
                *)&this->Processes,
               (unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                *)pipeFd);
    std::
    unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
    ::~unique_ptr((unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                   *)pipeFd);
    pPVar2 = (this->Processes).
             super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
             .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>.
             _M_head_impl;
    pPVar2->Data = this;
    (pPVar2->ProcessStatus).Finished = false;
    if (!bVar7) {
      _Var3.
      super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
      .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>._M_head_impl =
           (this->Processes).
           super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar8 - 1]._M_t.
           super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
      ;
      iVar4 = cmGetPipes(pipeFd);
      if (iVar4 < 0) {
        return false;
      }
      this_00 = (uv_pipe_ptr *)
                ((long)_Var3.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>.
                       _M_head_impl + 0x28);
      iVar4 = cm::uv_pipe_ptr::init(this_00,(EVP_PKEY_CTX *)this->Loop);
      if (iVar4 < 0) {
        return false;
      }
      puVar6 = cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_((uv_handle_ptr_<uv_pipe_s> *)this_00)
      ;
      iVar4 = uv_pipe_open(puVar6,pipeFd[1]);
      if (iVar4 < 0) {
        return false;
      }
      iVar4 = cm::uv_pipe_ptr::init(&pPVar2->InputPipe,(EVP_PKEY_CTX *)this->Loop);
      if (iVar4 < 0) {
        return false;
      }
      puVar6 = cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                         (&(pPVar2->InputPipe).super_uv_handle_ptr_<uv_pipe_s>);
      iVar4 = uv_pipe_open(puVar6,pipeFd[0]);
      if (iVar4 < 0) {
        return bVar9;
      }
    }
    uVar8 = uVar8 + 1;
    bVar7 = false;
  } while( true );
}

Assistant:

bool cmUVProcessChain::InternalData::Prepare(
  const cmUVProcessChainBuilder* builder)
{
  this->Builder = builder;

  if (this->Builder->Loop) {
    this->Loop = this->Builder->Loop;
  } else {
    this->BuiltinLoop.init();
    this->Loop = this->BuiltinLoop;
  }

  auto const& input =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_INPUT];
  auto& inputData = this->InputStreamData;
  switch (input.Type) {
    case cmUVProcessChainBuilder::None:
      inputData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin: {
      // FIXME
      break;
    }

    case cmUVProcessChainBuilder::External:
      inputData.Stdio.flags = UV_INHERIT_FD;
      inputData.Stdio.data.fd = input.FileDescriptor;
      break;
  }

  auto const& error =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_ERROR];
  auto& errorData = this->ErrorStreamData;
  switch (error.Type) {
    case cmUVProcessChainBuilder::None:
      errorData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin: {
      int pipeFd[2];
      if (cmGetPipes(pipeFd) < 0) {
        return false;
      }

      errorData.BuiltinStream = pipeFd[0];
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = pipeFd[1];

      if (this->TempErrorPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(this->TempErrorPipe, errorData.Stdio.data.fd) < 0) {
        return false;
      }

      break;
    }

    case cmUVProcessChainBuilder::External:
      errorData.Stdio.flags = UV_INHERIT_FD;
      errorData.Stdio.data.fd = error.FileDescriptor;
      break;
  }

  auto const& output =
    this->Builder->Stdio[cmUVProcessChainBuilder::Stream_OUTPUT];
  auto& outputData = this->OutputStreamData;
  switch (output.Type) {
    case cmUVProcessChainBuilder::None:
      outputData.Stdio.flags = UV_IGNORE;
      break;

    case cmUVProcessChainBuilder::Builtin:
      if (this->Builder->MergedBuiltinStreams) {
        outputData.BuiltinStream = errorData.BuiltinStream;
        outputData.Stdio.flags = UV_INHERIT_FD;
        outputData.Stdio.data.fd = errorData.Stdio.data.fd;
      } else {
        int pipeFd[2];
        if (cmGetPipes(pipeFd) < 0) {
          return false;
        }

        outputData.BuiltinStream = pipeFd[0];
        outputData.Stdio.flags = UV_INHERIT_FD;
        outputData.Stdio.data.fd = pipeFd[1];

        if (this->TempOutputPipe.init(*this->Loop, 0) < 0) {
          return false;
        }
        if (uv_pipe_open(this->TempOutputPipe, outputData.Stdio.data.fd) < 0) {
          return false;
        }
      }
      break;

    case cmUVProcessChainBuilder::External:
      outputData.Stdio.flags = UV_INHERIT_FD;
      outputData.Stdio.data.fd = output.FileDescriptor;
      break;
  }

  bool first = true;
  for (std::size_t i = 0; i < this->Builder->Processes.size(); i++) {
    this->Processes.emplace_back(cm::make_unique<ProcessData>());
    auto& process = *this->Processes.back();
    process.Data = this;
    process.ProcessStatus.Finished = false;

    if (!first) {
      auto& prevProcess = *this->Processes[i - 1];

      int pipeFd[2];
      if (cmGetPipes(pipeFd) < 0) {
        return false;
      }

      if (prevProcess.OutputPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(prevProcess.OutputPipe, pipeFd[1]) < 0) {
        return false;
      }
      if (process.InputPipe.init(*this->Loop, 0) < 0) {
        return false;
      }
      if (uv_pipe_open(process.InputPipe, pipeFd[0]) < 0) {
        return false;
      }
    }

    first = false;
  }

  return true;
}